

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microterm.cpp
# Opt level: O3

void __thiscall MicroTerm::MicroTerm(MicroTerm *this,char *t0,char *t1)

{
  Stream *pSVar1;
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  Dashel::Hub::Hub(&this->super_Hub,true);
  *(undefined ***)this = &PTR__Hub_00104d40;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,t0,&local_39);
  pSVar1 = (Stream *)Dashel::Hub::connect((string *)this);
  this->s0 = pSVar1;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,t1,&local_39);
  pSVar1 = (Stream *)Dashel::Hub::connect((string *)this);
  this->s1 = pSVar1;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

MicroTerm(const char* t0, const char* t1)
	{
		s0 = connect(t0);
		s1 = connect(t1);
	}